

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

uint8_t __thiscall
VmaAllocation_T::SwapBlockAllocation
          (VmaAllocation_T *this,VmaAllocator hAllocator,VmaAllocation allocation)

{
  uint32_t uVar1;
  VmaBlockMetadata *pVVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  VmaAllocHandle pVVar5;
  BlockAllocation __tmp;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  if (this->m_MapCount != 0) {
    VmaDeviceMemoryBlock::Unmap
              ((this->field_0).m_BlockAllocation.m_Block,hAllocator,(uint)this->m_MapCount);
  }
  pVVar2 = ((this->field_0).m_BlockAllocation.m_Block)->m_pMetadata;
  (*pVVar2->_vptr_VmaBlockMetadata[0x16])
            (pVVar2,(this->field_0).m_BlockAllocation.m_AllocHandle,allocation);
  uVar3 = *(undefined8 *)&this->field_0;
  uVar4 = *(undefined8 *)((long)&this->field_0 + 8);
  pVVar5 = (allocation->field_0).m_BlockAllocation.m_AllocHandle;
  (this->field_0).m_BlockAllocation.m_Block = (allocation->field_0).m_BlockAllocation.m_Block;
  (this->field_0).m_BlockAllocation.m_AllocHandle = pVVar5;
  local_28 = (undefined4)uVar3;
  uStack_24 = (undefined4)((ulong)uVar3 >> 0x20);
  uStack_20 = (undefined4)uVar4;
  uStack_1c = (undefined4)((ulong)uVar4 >> 0x20);
  *(undefined4 *)&allocation->field_0 = local_28;
  *(undefined4 *)((long)&allocation->field_0 + 4) = uStack_24;
  *(undefined4 *)((long)&allocation->field_0 + 8) = uStack_20;
  *(undefined4 *)((long)&allocation->field_0 + 0xc) = uStack_1c;
  pVVar2 = ((this->field_0).m_BlockAllocation.m_Block)->m_pMetadata;
  (*pVVar2->_vptr_VmaBlockMetadata[0x16])
            (pVVar2,(this->field_0).m_BlockAllocation.m_AllocHandle,this);
  uVar1 = this->m_BufferImageUsage;
  this->m_BufferImageUsage = allocation->m_BufferImageUsage;
  allocation->m_BufferImageUsage = uVar1;
  return this->m_MapCount;
}

Assistant:

uint8_t VmaAllocation_T::SwapBlockAllocation(VmaAllocator hAllocator, VmaAllocation allocation)
{
    VMA_ASSERT(allocation != VMA_NULL);
    VMA_ASSERT(m_Type == ALLOCATION_TYPE_BLOCK);
    VMA_ASSERT(allocation->m_Type == ALLOCATION_TYPE_BLOCK);

    if (m_MapCount != 0)
        m_BlockAllocation.m_Block->Unmap(hAllocator, m_MapCount);

    m_BlockAllocation.m_Block->m_pMetadata->SetAllocationUserData(m_BlockAllocation.m_AllocHandle, allocation);
    VMA_SWAP(m_BlockAllocation, allocation->m_BlockAllocation);
    m_BlockAllocation.m_Block->m_pMetadata->SetAllocationUserData(m_BlockAllocation.m_AllocHandle, this);

#if VMA_STATS_STRING_ENABLED
    VMA_SWAP(m_BufferImageUsage, allocation->m_BufferImageUsage);
#endif
    return m_MapCount;
}